

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O1

void __thiscall UrsaClient::setup_connection(UrsaClient *this)

{
  void *pvVar1;
  void *pvVar2;
  source_loc loc;
  logger *this_00;
  socklen_t sVar3;
  sockaddr *__addr;
  sockaddr *__addr_00;
  int iVar4;
  UrsaClient *in_R8;
  socklen_t in_R9D;
  string_view_t fmt;
  socket_t socket;
  undefined4 local_3c;
  socket_t local_38;
  undefined8 local_28;
  
  if (this->is_interactive == true) {
    this_00 = spdlog::default_logger_raw();
    local_38.super_socket_base._handle = (void *)0x0;
    local_38.ctxptr = (void *)0x0;
    local_28 = 0;
    loc.funcname = (char *)0x0;
    loc.filename = (char *)0x0;
    loc.line = 0;
    loc._12_4_ = 0;
    fmt.size_ = 0x10;
    fmt.data_ = "Connecting to {}";
    in_R8 = this;
    spdlog::logger::log<std::__cxx11::string>(this_00,loc,info,fmt,&this->server_addr);
  }
  zmq::socket_t::socket_t(&local_38,&this->context,3);
  local_3c = 0;
  zmq::detail::socket_base::setsockopt
            (&local_38.super_socket_base,0x11,(int)&local_3c,4,in_R8,in_R9D);
  local_3c = 1000;
  sVar3 = 4;
  zmq::detail::socket_base::setsockopt
            (&local_38.super_socket_base,0x1b,(int)&local_3c,4,in_R8,in_R9D);
  iVar4 = (int)(this->server_addr)._M_dataplus._M_p;
  zmq::detail::socket_base::connect(&local_38.super_socket_base,iVar4,__addr,sVar3);
  zmq::socket_t::close(&this->cmd_socket,iVar4);
  pvVar1 = (this->cmd_socket).super_socket_base._handle;
  pvVar2 = (this->cmd_socket).ctxptr;
  (this->cmd_socket).super_socket_base._handle = local_38.super_socket_base._handle;
  (this->cmd_socket).ctxptr = local_38.ctxptr;
  local_38.super_socket_base._handle = pvVar1;
  local_38.ctxptr = pvVar2;
  zmq::socket_t::close(&local_38,iVar4);
  check_conn_status(this,&this->cmd_socket);
  zmq::socket_t::socket_t(&local_38,&this->context,3);
  local_3c = 0;
  zmq::detail::socket_base::setsockopt
            (&local_38.super_socket_base,0x11,(int)&local_3c,4,in_R8,in_R9D);
  local_3c = 1000;
  sVar3 = 4;
  zmq::detail::socket_base::setsockopt
            (&local_38.super_socket_base,0x1b,(int)&local_3c,4,in_R8,in_R9D);
  iVar4 = (int)(this->server_addr)._M_dataplus._M_p;
  zmq::detail::socket_base::connect(&local_38.super_socket_base,iVar4,__addr_00,sVar3);
  zmq::socket_t::close(&this->status_socket,iVar4);
  pvVar1 = (this->status_socket).super_socket_base._handle;
  pvVar2 = (this->status_socket).ctxptr;
  (this->status_socket).super_socket_base._handle = local_38.super_socket_base._handle;
  (this->status_socket).ctxptr = local_38.ctxptr;
  local_38.super_socket_base._handle = pvVar1;
  local_38.ctxptr = pvVar2;
  zmq::socket_t::close(&local_38,iVar4);
  return;
}

Assistant:

void UrsaClient::setup_connection() {
    auto make_socket = [this]() {
        zmq::socket_t socket(context, ZMQ_REQ);
        socket.setsockopt(ZMQ_LINGER, 0);
        socket.setsockopt(ZMQ_RCVTIMEO, 1000);
        socket.connect(server_addr);
        return socket;
    };

    if (is_interactive) {
        spdlog::info("Connecting to {}", server_addr);
    }
    cmd_socket = make_socket();
    check_conn_status(&cmd_socket);
    status_socket = make_socket();
}